

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceDecomposition::unpackSelfData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  value_type vVar1;
  reference pvVar2;
  int in_EDX;
  long in_RSI;
  Vector<double,_7U> *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  Vector<double,_7U>::operator=
            ((Vector<double,_7U> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RDI);
  Vector<double,_7U>::operator=
            ((Vector<double,_7U> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RDI);
  if (((ulong)in_RDI->data_[6] & 0x10000) != 0) {
    vVar1 = *(value_type *)(in_RSI + 0x78);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RDI->data_[3] + 0x180),
                        (long)in_EDX);
    *pvVar2 = vVar1;
  }
  return;
}

Assistant:

void ForceDecomposition::unpackSelfData(SelfData& sdat, int atom) {
    selfPot         = sdat.selfPot;
    selectedSelfPot = sdat.selePot;

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      snap_->atomData.flucQFrc[atom] = sdat.flucQfrc;
    }
  }